

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O0

void __thiscall
pbrt::ProjectiveCamera::ProjectiveCamera
          (ProjectiveCamera *this,CameraBaseParameters *baseParameters,Transform *screenFromCamera,
          Bounds2f *screenWindow,Float lensRadius,Float focalDistance)

{
  void *in_RDX;
  CameraBaseParameters *in_RDI;
  Float in_XMM0_Da;
  Float in_XMM1_Da;
  Transform rasterFromNDC;
  Transform NDCFromScreen;
  float in_stack_fffffffffffff858;
  float in_stack_fffffffffffff85c;
  CameraBaseParameters *in_stack_fffffffffffff868;
  CameraBase *in_stack_fffffffffffff870;
  Transform *in_stack_fffffffffffff8e8;
  Transform *in_stack_fffffffffffff8f0;
  Vector3f *in_stack_fffffffffffff920;
  Float in_stack_fffffffffffff92c;
  Float in_stack_fffffffffffff930;
  Float in_stack_fffffffffffff934;
  undefined1 local_694 [128];
  undefined1 local_614 [128];
  Tuple2<pbrt::Point2,_int> local_594;
  Tuple2<pbrt::Point2,_int> local_58c;
  Float local_28;
  Float local_24;
  void *local_18;
  
  local_28 = in_XMM1_Da;
  local_24 = in_XMM0_Da;
  local_18 = in_RDX;
  CameraBaseParameters::CameraBaseParameters
            (in_RDI,(CameraBaseParameters *)
                    CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
  CameraBase::CameraBase(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  memcpy(in_RDI[1].cameraTransform.renderFromCamera.startTransform.m.m + 3,local_18,0x80);
  Transform::Transform((Transform *)in_RDI);
  Transform::Transform((Transform *)in_RDI);
  Transform::Transform((Transform *)in_RDI);
  in_RDI[1].cameraTransform.renderFromCamera.c3[0].ky = local_24;
  in_RDI[1].cameraTransform.renderFromCamera.c3[0].kz = local_28;
  Scale(in_stack_fffffffffffff934,in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
  Vector3<float>::Vector3
            ((Vector3<float> *)in_RDI,in_stack_fffffffffffff85c,in_stack_fffffffffffff858,0.0);
  Translate(in_stack_fffffffffffff920);
  Transform::operator*(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  local_58c = (Tuple2<pbrt::Point2,_int>)
              FilmHandle::FullResolution
                        ((FilmHandle *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858)
                        );
  local_594 = (Tuple2<pbrt::Point2,_int>)
              FilmHandle::FullResolution
                        ((FilmHandle *)CONCAT44((float)local_58c.x,in_stack_fffffffffffff858));
  Scale(in_stack_fffffffffffff934,in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
  Transform::operator*(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  memcpy(&in_RDI[1].cameraTransform.renderFromCamera.R[0].w,local_614,0x80);
  Inverse((Transform *)in_stack_fffffffffffff870);
  memcpy(in_RDI[1].cameraTransform.renderFromCamera.S[1].m[2] + 3,local_694,0x80);
  Inverse((Transform *)in_stack_fffffffffffff870);
  Transform::operator*(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  memcpy(in_RDI[1].cameraTransform.renderFromCamera.endTransform.m.m + 3,&stack0xfffffffffffff8ec,
         0x80);
  return;
}

Assistant:

ProjectiveCamera(CameraBaseParameters baseParameters,
                     const Transform &screenFromCamera, const Bounds2f &screenWindow,
                     Float lensRadius, Float focalDistance)
        : CameraBase(baseParameters),
          screenFromCamera(screenFromCamera),
          lensRadius(lensRadius),
          focalDistance(focalDistance) {
        // Compute projective camera transformations
        // Compute projective camera screen transformations
        Transform NDCFromScreen =
            Scale(1 / (screenWindow.pMax.x - screenWindow.pMin.x),
                  1 / (screenWindow.pMax.y - screenWindow.pMin.y), 1) *
            Translate(Vector3f(-screenWindow.pMin.x, -screenWindow.pMax.y, 0));
        Transform rasterFromNDC =
            Scale(film.FullResolution().x, -film.FullResolution().y, 1);
        rasterFromScreen = rasterFromNDC * NDCFromScreen;
        screenFromRaster = Inverse(rasterFromScreen);

        cameraFromRaster = Inverse(screenFromCamera) * screenFromRaster;
    }